

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O2

int uv__ifaddr_exclude(ifaddrs *ent,int exclude_type)

{
  uint uVar1;
  
  uVar1 = 1;
  if (((~ent->ifa_flags & 0x41) == 0) && (ent->ifa_addr != (sockaddr *)0x0)) {
    if (ent->ifa_addr->sa_family == 0x11) {
      return exclude_type;
    }
    uVar1 = (uint)(exclude_type == 0);
  }
  return uVar1;
}

Assistant:

static int uv__ifaddr_exclude(struct ifaddrs *ent, int exclude_type) {
  if (!((ent->ifa_flags & IFF_UP) && (ent->ifa_flags & IFF_RUNNING)))
    return 1;
  if (ent->ifa_addr == NULL)
    return 1;
  /*
   * On Linux getifaddrs returns information related to the raw underlying
   * devices. We're not interested in this information yet.
   */
  if (ent->ifa_addr->sa_family == PF_PACKET)
    return exclude_type;
  return !exclude_type;
}